

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * gmlc::utilities::convertToUpperCase_abi_cxx11_(string_view input)

{
  pointer pcVar1;
  string *in_RDI;
  allocator<char> local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)in_RDI,&local_18,&local_19);
  pcVar1 = (in_RDI->_M_dataplus)._M_p;
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,gmlc::utilities::__1>
            (pcVar1,pcVar1 + in_RDI->_M_string_length,pcVar1);
  return in_RDI;
}

Assistant:

std::string convertToUpperCase(std::string_view input)
{
    std::string out(input);
    std::transform(out.begin(), out.end(), out.begin(), upper);
    return out;
}